

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeBeginTrans(Btree *p,int wrflag)

{
  int *piVar1;
  ushort uVar2;
  uint uVar3;
  Pgno PVar4;
  BtShared *pBt;
  Pager *pPVar5;
  Wal *pWVar6;
  MemPage *pMVar7;
  sqlite3 *psVar8;
  _func_int_void_ptr_int *p_Var9;
  uint uVar10;
  char cVar11;
  byte bVar12;
  int iVar13;
  int iVar14;
  MemPage *pPage1_1;
  BtLock *pBVar15;
  u16 uVar16;
  Btree *pBVar17;
  u32 uVar18;
  uint uVar19;
  u8 *puVar20;
  u32 uVar21;
  uint uVar22;
  Wal *pWVar23;
  undefined1 auVar24 [16];
  MemPage *pPage1;
  int local_54;
  Btree *local_50;
  u32 local_44;
  u32 *local_40;
  MemPage *local_38;
  
  pBt = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if (p->inTrans == '\x02') {
LAB_001174dc:
    iVar13 = 0;
    if (wrflag != 0) {
      pPVar5 = pBt->pPager;
      iVar14 = p->db->nSavepoint;
      if ((pPVar5->nSavepoint < iVar14) && (pPVar5->useJournal != '\0')) {
        iVar13 = pagerOpenSavepoint(pPVar5,iVar14);
      }
    }
    goto LAB_00117bb0;
  }
  if (wrflag == 0 && p->inTrans == '\x01') {
LAB_00117bad:
    iVar13 = 0;
    goto LAB_00117bb0;
  }
  if ((wrflag != 0) && (iVar13 = 8, (pBt->btsFlags & 1) != 0)) goto LAB_00117bb0;
  cVar11 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar11 < '\0') goto LAB_00117573;
  }
  else if ((cVar11 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_00117573:
    pBVar17 = pBt->pWriter;
LAB_00117577:
    iVar13 = 0x106;
    if (pBVar17->db != (sqlite3 *)0x0) goto LAB_00117bb0;
  }
  else if (1 < wrflag) {
    for (pBVar15 = pBt->pLock; pBVar15 != (BtLock *)0x0; pBVar15 = pBVar15->pNext) {
      pBVar17 = pBVar15->pBtree;
      if (pBVar17 != p) goto LAB_00117577;
    }
  }
  iVar13 = querySharedCacheTableLock(p,1,'\x01');
  if (iVar13 == 0) {
    uVar2 = pBt->btsFlags;
    pBt->btsFlags = uVar2 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt->pageSize;
    iVar13 = 0;
    local_50 = p;
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        do {
          iVar13 = sqlite3PagerSharedLock(pBt->pPager);
          if ((iVar13 != 0) ||
             (iVar13 = btreeGetPage(pBt,1,&local_38,0), pMVar7 = local_38, iVar13 != 0))
          goto LAB_00117a7b;
          puVar20 = local_38->aData;
          uVar19 = *(uint *)(puVar20 + 0x1c);
          uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                   uVar19 << 0x18;
          uVar21 = pBt->pPager->dbSize;
          if ((uVar19 == 0) || (*(int *)(puVar20 + 0x18) != *(int *)(puVar20 + 0x5c))) {
            uVar19 = uVar21;
          }
          if (0 < (int)uVar19) {
            auVar24[0] = -(*puVar20 == 'S');
            auVar24[1] = -(puVar20[1] == 'Q');
            auVar24[2] = -(puVar20[2] == 'L');
            auVar24[3] = -(puVar20[3] == 'i');
            auVar24[4] = -(puVar20[4] == 't');
            auVar24[5] = -(puVar20[5] == 'e');
            auVar24[6] = -(puVar20[6] == ' ');
            auVar24[7] = -(puVar20[7] == 'f');
            auVar24[8] = -(puVar20[8] == 'o');
            auVar24[9] = -(puVar20[9] == 'r');
            auVar24[10] = -(puVar20[10] == 'm');
            auVar24[0xb] = -(puVar20[0xb] == 'a');
            auVar24[0xc] = -(puVar20[0xc] == 't');
            auVar24[0xd] = -(puVar20[0xd] == ' ');
            auVar24[0xe] = -(puVar20[0xe] == '3');
            auVar24[0xf] = -(puVar20[0xf] == '\0');
            iVar14 = 0x1a;
            iVar13 = iVar14;
            if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
              if (2 < puVar20[0x12]) {
                *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
              }
              if (puVar20[0x13] < 3) {
                if ((puVar20[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                  local_54 = 0;
                  local_44 = uVar21;
                  iVar13 = sqlite3PagerOpenWal(pBt->pPager,&local_54);
                  if (iVar13 == 0) {
                    uVar21 = local_44;
                    if (local_54 != 0) goto LAB_001177a4;
                    sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
                    goto LAB_0011790f;
                  }
                }
                else {
LAB_001177a4:
                  iVar13 = iVar14;
                  if (puVar20[0x17] == ' ' && *(short *)(puVar20 + 0x15) == 0x2040) {
                    uVar10 = (uint)puVar20[0x10] * 0x100;
                    uVar3 = (uint)puVar20[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar3 + uVar10) - 0x10001) &&
                       (uVar22 = uVar3 | uVar10, ((uVar10 + uVar3) - 1 & uVar22) == 0)) {
                      bVar12 = puVar20[0x14];
                      uVar18 = uVar22 - bVar12;
                      if (uVar22 != *local_40) {
                        sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
                        pBt->usableSize = uVar18;
                        pBt->pageSize = uVar22;
                        if (pBt->pTmpSpace != (u8 *)0x0) {
                          puVar20 = pBt->pTmpSpace + -4;
                          pBt->pTmpSpace = puVar20;
                          pcache1Free(puVar20);
                          pBt->pTmpSpace = (u8 *)0x0;
                        }
                        iVar13 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar12);
                        if (iVar13 == 0) goto LAB_0011790f;
                        goto LAB_00117a7b;
                      }
                      if (((pBt->db->flags & 1) == 0) && ((int)uVar21 < (int)uVar19)) {
                        iVar13 = 0xb;
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf48d,
                                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34"
                                   );
                      }
                      else if (0x1df < uVar18) {
                        pBt->pageSize = uVar22;
                        pBt->usableSize = uVar18;
                        uVar3 = *(uint *)(puVar20 + 0x34);
                        pBt->autoVacuum =
                             ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) ||
                             (uVar3 & 0xff00) != 0) || (uVar3 & 0xff) != 0;
                        uVar3 = *(uint *)(puVar20 + 0x40);
                        pBt->incrVacuum =
                             ((uVar3 >> 0x18 != 0 || (uVar3 & 0xff0000) != 0) ||
                             (uVar3 & 0xff00) != 0) || (uVar3 & 0xff) != 0;
                        goto LAB_0011785a;
                      }
                    }
                  }
                }
              }
            }
            sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
            pBt->pPage1 = (MemPage *)0x0;
            goto LAB_00117a7b;
          }
          uVar18 = pBt->usableSize;
LAB_0011785a:
          iVar13 = (uVar18 * 0x40 - 0x300) / 0xff - 0x17;
          pBt->maxLocal = (ushort)iVar13;
          uVar16 = (short)((uVar18 * 0x20 - 0x180) / 0xff) - 0x17;
          pBt->minLocal = uVar16;
          pBt->maxLeaf = (short)uVar18 - 0x23;
          pBt->minLeaf = uVar16;
          if (0x7e < (ushort)iVar13) {
            iVar13 = 0x7f;
          }
          pBt->max1bytePayload = (u8)iVar13;
          pBt->pPage1 = pMVar7;
          pBt->nPage = uVar19;
LAB_0011790f:
        } while (pBt->pPage1 == (MemPage *)0x0);
        iVar13 = 0;
      }
      if ((wrflag == 0) || (iVar13 != 0)) {
LAB_00117a50:
        p = local_50;
        if (iVar13 == 0) {
          if ((local_50->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, local_50->sharable != '\0')) {
            (local_50->lock).eLock = '\x01';
            (local_50->lock).pNext = pBt->pLock;
            pBt->pLock = &local_50->lock;
          }
          bVar12 = 2 - (wrflag == 0);
          local_50->inTrans = bVar12;
          if (pBt->inTransaction < bVar12) {
            pBt->inTransaction = bVar12;
          }
          if (wrflag == 0) goto LAB_00117bad;
          pMVar7 = pBt->pPage1;
          pBt->pWriter = local_50;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | pBt->btsFlags & 0xffbf;
          uVar19 = *(uint *)(pMVar7->aData + 0x1c);
          if (pBt->nPage ==
              (uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18))
          goto LAB_001174dc;
          iVar13 = sqlite3PagerWrite(pMVar7->pDbPage);
          if (iVar13 != 0) break;
          uVar19 = pBt->nPage;
          *(uint *)(pMVar7->aData + 0x1c) =
               uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
          goto LAB_001174dc;
        }
      }
      else {
        iVar13 = 8;
        if ((pBt->btsFlags & 1) == 0) {
          pPVar5 = pBt->pPager;
          iVar13 = pPVar5->errCode;
          if (iVar13 == 0) {
            pPVar5->subjInMemory = local_50->db->temp_store == '\x02';
            if (pPVar5->eState != '\x01') {
LAB_00117a45:
              iVar13 = newDatabase(pBt);
              goto LAB_00117a50;
            }
            pWVar23 = pPVar5->pWal;
            if (pWVar23 == (Wal *)0x0) {
              iVar13 = pagerLockDb(pPVar5,2);
              if (iVar13 == 0 && 1 < wrflag) {
                do {
                  iVar13 = pagerLockDb(pPVar5,4);
                  if (iVar13 != 5) goto LAB_00117a1d;
                  iVar14 = (*pPVar5->xBusyHandler)(pPVar5->pBusyHandlerArg);
                  iVar13 = 5;
                } while (iVar14 != 0);
              }
              else {
LAB_00117a1d:
                if (iVar13 == 0) goto LAB_00117a22;
              }
            }
            else {
              if ((pPVar5->exclusiveMode != '\0') && (pWVar23->exclusiveMode == '\0')) {
                iVar13 = pagerLockDb(pPVar5,4);
                if (iVar13 != 0) goto LAB_00117a7b;
                pWVar6 = pPVar5->pWal;
                pWVar23 = pWVar6;
                if (pWVar6->exclusiveMode == '\0') {
                  (*pWVar6->pDbFd->pMethods->xShmLock)(pWVar6->pDbFd,pWVar6->readLock + 3,1,5);
                  pWVar23 = pPVar5->pWal;
                }
                pWVar6->exclusiveMode = '\x01';
              }
              iVar13 = 8;
              if ((pWVar23->readOnly == '\0') &&
                 ((pWVar23->exclusiveMode != '\0' ||
                  (iVar13 = (*pWVar23->pDbFd->pMethods->xShmLock)(pWVar23->pDbFd,0,1,10),
                  iVar13 == 0)))) {
                pWVar23->writeLock = '\x01';
                iVar13 = bcmp(&pWVar23->hdr,*pWVar23->apWiData,0x30);
                if (iVar13 == 0) {
LAB_00117a22:
                  pPVar5->eState = '\x02';
                  PVar4 = pPVar5->dbSize;
                  pPVar5->dbHintSize = PVar4;
                  pPVar5->dbFileSize = PVar4;
                  pPVar5->dbOrigSize = PVar4;
                  pPVar5->journalOff = 0;
                  goto LAB_00117a45;
                }
                if (pWVar23->exclusiveMode == '\0') {
                  (*pWVar23->pDbFd->pMethods->xShmLock)(pWVar23->pDbFd,0,1,9);
                }
                pWVar23->writeLock = '\0';
                iVar13 = 0x205;
              }
            }
          }
        }
      }
LAB_00117a7b:
      if ((pBt->inTransaction == '\0') && (pMVar7 = pBt->pPage1, pMVar7 != (MemPage *)0x0)) {
        pBt->pPage1 = (MemPage *)0x0;
        sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
      }
      p = local_50;
      if (((char)iVar13 != '\x05') || (pBt->inTransaction != '\0')) break;
      psVar8 = pBt->db;
      p_Var9 = (psVar8->busyHandler).xFunc;
      if ((p_Var9 == (_func_int_void_ptr_int *)0x0) ||
         (iVar14 = (psVar8->busyHandler).nBusy, iVar14 < 0)) break;
      iVar14 = (*p_Var9)((psVar8->busyHandler).pArg,iVar14);
      if (iVar14 == 0) goto LAB_00117afa;
      piVar1 = &(psVar8->busyHandler).nBusy;
      *piVar1 = *piVar1 + 1;
    } while( true );
  }
LAB_00117bb0:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar13;
LAB_00117afa:
  (psVar8->busyHandler).nBusy = -1;
  goto LAB_00117bb0;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }


trans_begun:
  if( rc==SQLITE_OK && wrflag ){
    /* This call makes sure that the pager has the correct number of
    ** open savepoints. If the second parameter is greater than 0 and
    ** the sub-journal is not already open, then it will be opened here.
    */
    rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}